

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O1

bool __thiscall Am_Font_Data::Get_Font(Am_Font_Data *this,Display *dpy,XFontStruct **xfont)

{
  bool bVar1;
  Font_Index *pFVar2;
  
  pFVar2 = this->font_head;
  while( true ) {
    bVar1 = pFVar2 != (Font_Index *)0x0;
    if (pFVar2 == (Font_Index *)0x0) {
      return bVar1;
    }
    if (pFVar2->dpy == dpy) break;
    pFVar2 = pFVar2->next;
  }
  *xfont = pFVar2->xfont;
  return bVar1;
}

Assistant:

bool
Am_Font_Data::Get_Font(Display *dpy, XFontStruct *&xfont)
{
  Font_Index *current;
  for (current = font_head; current != nullptr; current = current->next)
    if (current->dpy == dpy) {
      xfont = current->xfont;
      return true;
    }
  return false;
}